

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O2

exr_result_t
internal_encode_alloc_buffer
          (exr_encode_pipeline_t *encode,exr_transcoding_pipeline_buffer_id_t bufid,void **buf,
          size_t *cursz,size_t newsz)

{
  exr_result_t eVar1;
  void *pvVar2;
  exr_transcoding_pipeline_buffer_id_t eVar3;
  char *pcVar4;
  undefined8 uVar5;
  exr_const_context_t p_Var6;
  code *UNRECOVERED_JUMPTABLE;
  
  if (newsz == 0) {
    p_Var6 = encode->context;
    if (p_Var6 == (exr_const_context_t)0x0) {
      return 2;
    }
    eVar3 = encode->part_index;
    if ((-1 < (int)eVar3) && ((int)eVar3 < *(int *)(p_Var6 + 0xc4))) {
      UNRECOVERED_JUMPTABLE = *(code **)(p_Var6 + 0x48);
      pcVar4 = "Attempt to allocate 0 byte buffer for transcode buffer %d";
      uVar5 = 3;
      goto LAB_0011e4c7;
    }
  }
  else {
    if ((*buf != (void *)0x0) && (newsz <= *cursz)) {
      return 0;
    }
    internal_encode_free_buffer(encode,bufid,buf,cursz);
    if (encode->alloc_fn == (_func_void_ptr_exr_transcoding_pipeline_buffer_id_t_size_t *)0x0) {
      p_Var6 = encode->context;
      if (p_Var6 == (exr_const_context_t)0x0) {
        return 2;
      }
      bufid = encode->part_index;
      if (((int)bufid < 0) || (*(int *)(p_Var6 + 0xc4) <= (int)bufid)) {
        UNRECOVERED_JUMPTABLE = *(code **)(p_Var6 + 0x48);
        pcVar4 = "Part index (%d) out of range";
        uVar5 = 4;
        goto LAB_0011e4c7;
      }
      pvVar2 = (void *)(**(code **)(p_Var6 + 0x58))(newsz);
    }
    else {
      pvVar2 = (*encode->alloc_fn)(bufid,newsz);
    }
    if (pvVar2 != (void *)0x0) {
      *buf = pvVar2;
      *cursz = newsz;
      return 0;
    }
    p_Var6 = encode->context;
    if (p_Var6 == (exr_const_context_t)0x0) {
      return 2;
    }
    eVar3 = encode->part_index;
    if ((-1 < (int)eVar3) && ((int)eVar3 < *(int *)(p_Var6 + 0xc4))) {
      eVar1 = (**(code **)(p_Var6 + 0x48))
                        (p_Var6,1,"Unable to allocate %lu bytes",newsz,*(code **)(p_Var6 + 0x48));
      return eVar1;
    }
  }
  UNRECOVERED_JUMPTABLE = *(code **)(p_Var6 + 0x48);
  pcVar4 = "Part index (%d) out of range";
  uVar5 = 4;
  bufid = eVar3;
LAB_0011e4c7:
  eVar1 = (*UNRECOVERED_JUMPTABLE)(p_Var6,uVar5,pcVar4,bufid,UNRECOVERED_JUMPTABLE);
  return eVar1;
}

Assistant:

exr_result_t
internal_encode_alloc_buffer (
    exr_encode_pipeline_t*               encode,
    exr_transcoding_pipeline_buffer_id_t bufid,
    void**                               buf,
    size_t*                              cursz,
    size_t                               newsz)
{
    void* curbuf = *buf;
    if (newsz == 0)
    {
        EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR_NO_LOCK (
            encode->context, encode->part_index);

        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Attempt to allocate 0 byte buffer for transcode buffer %d",
            (int) bufid);
    }

    if (!curbuf || *cursz < newsz)
    {
        internal_encode_free_buffer (encode, bufid, buf, cursz);

        if (encode->alloc_fn)
            curbuf = encode->alloc_fn (bufid, newsz);
        else
        {
            EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR_NO_LOCK (
                encode->context, encode->part_index);

            curbuf = pctxt->alloc_fn (newsz);
        }

        if (curbuf == NULL)
        {
            EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR_NO_LOCK (
                encode->context, encode->part_index);

            return pctxt->print_error (
                pctxt,
                EXR_ERR_OUT_OF_MEMORY,
                "Unable to allocate %" PRIu64 " bytes",
                (uint64_t) newsz);
        }

        *buf   = curbuf;
        *cursz = newsz;
    }
    return EXR_ERR_SUCCESS;
}